

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

jx9_int64 UnixVfs_FileSize(char *zPath)

{
  int iVar1;
  undefined1 local_a8 [4];
  int rc;
  stat st;
  char *zPath_local;
  
  st.__glibc_reserved[2] = (__syscall_slong_t)zPath;
  iVar1 = stat(zPath,(stat *)local_a8);
  if (iVar1 == 0) {
    zPath_local = (char *)st.st_rdev;
  }
  else {
    zPath_local = (char *)0xffffffffffffffff;
  }
  return (jx9_int64)zPath_local;
}

Assistant:

static jx9_int64 UnixVfs_FileSize(const char *zPath)
{
	struct stat st;
	int rc;
	rc = stat(zPath, &st);
	if( rc != 0 ){ 
	 return -1;
	}
	return (jx9_int64)st.st_size;
}